

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

VariableData *
AddFunctionUpvalue(ExpressionContext *ctx,SynBase *source,FunctionData *function,VariableData *data)

{
  Node *pNVar1;
  TypeBase *pTVar2;
  _func_int **pp_Var3;
  ScopeData *pSVar4;
  bool bVar5;
  uint uVar6;
  _func_int *p_Var7;
  TypeRef *pTVar8;
  VariableData *pVVar9;
  MemberHandle *pMVar10;
  VariableData *pVVar11;
  undefined4 extraout_var_00;
  VariableData *pVVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar13;
  IntrusiveList<MemberHandle> *this;
  uint uVar14;
  int iVar15;
  InplaceStr IVar16;
  InplaceStr suffix;
  InplaceStr suffix_00;
  UpvalueData *upvalue;
  uint in_stack_ffffffffffffff80;
  VariableData *local_40;
  UpvalueData *local_38;
  undefined4 extraout_var;
  
  uVar6 = (function->upvalueVariableMap).bucketCount;
  uVar13 = uVar6 - 1;
  if (uVar6 != 0) {
    uVar14 = data->uniqueId;
    pNVar1 = (function->upvalueVariableMap).data;
    iVar15 = 0;
    do {
      uVar14 = uVar14 & uVar13;
      pVVar9 = pNVar1[uVar14].key;
      if (pVVar9 == (VariableData *)0x0) break;
      if (pVVar9 == data) {
        return (pNVar1[uVar14].value)->target;
      }
      uVar14 = uVar14 + iVar15 + 1;
      iVar15 = iVar15 + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  pTVar2 = function->contextType;
  local_40 = data;
  if ((pTVar2 == (TypeBase *)0x0) || (pTVar2->typeID != 0x12)) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0xff7,
                  "VariableData *AddFunctionUpvalue(ExpressionContext &, SynBase *, FunctionData *, VariableData *)"
                 );
  }
  pp_Var3 = pTVar2[1]._vptr_TypeBase;
  if ((pp_Var3 != (_func_int **)0x0) && (*(int *)(pp_Var3 + 1) == 0x18)) {
    pSVar4 = ctx->scope;
    ctx->scope = (ScopeData *)pp_Var3[0xc];
    bVar5 = SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::contains
                      (&function->upvalueNameSet,&data->name->name);
    uVar6 = 0;
    if ((bVar5) && (p_Var7 = pp_Var3[0xd], uVar6 = 0, p_Var7 != (_func_int *)0x0)) {
      uVar6 = 0;
      do {
        uVar6 = uVar6 + 1;
        p_Var7 = *(_func_int **)(p_Var7 + 0x18);
      } while (p_Var7 != (_func_int *)0x0);
    }
    pTVar8 = ExpressionContext::GetReferenceType(ctx,data->type);
    IVar16.end = "";
    IVar16.begin = "target";
    IVar16 = GetFunctionContextMemberName(ctx,data->name->name,IVar16,uVar6);
    uVar13 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar13 + 1;
    pVVar9 = anon_unknown.dwarf_9c70f::AllocateClassMember
                       (ctx,source,0,&pTVar8->super_TypeBase,IVar16,SUB41(uVar13,0),
                        in_stack_ffffffffffffff80);
    this = (IntrusiveList<MemberHandle> *)(pp_Var3 + 0xd);
    iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar10 = (MemberHandle *)CONCAT44(extraout_var,iVar15);
    pMVar10->source = (SynBase *)0x0;
    pMVar10->variable = pVVar9;
    pMVar10->initializer = (SynBase *)0x0;
    pMVar10->next = (MemberHandle *)0x0;
    pMVar10->listed = false;
    IntrusiveList<MemberHandle>::push_back(this,pMVar10);
    pTVar8 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    suffix.end = "";
    suffix.begin = "nextUpvalue";
    IVar16 = GetFunctionContextMemberName(ctx,data->name->name,suffix,uVar6);
    uVar13 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar13 + 1;
    pVVar11 = anon_unknown.dwarf_9c70f::AllocateClassMember
                        (ctx,source,0,&pTVar8->super_TypeBase,IVar16,SUB41(uVar13,0),
                         in_stack_ffffffffffffff80);
    iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar10 = (MemberHandle *)CONCAT44(extraout_var_00,iVar15);
    pMVar10->source = (SynBase *)0x0;
    pMVar10->variable = pVVar11;
    pMVar10->initializer = (SynBase *)0x0;
    pMVar10->next = (MemberHandle *)0x0;
    pMVar10->listed = false;
    IntrusiveList<MemberHandle>::push_back(this,pMVar10);
    uVar13 = data->alignment;
    pTVar2 = data->type;
    suffix_00.end = "";
    suffix_00.begin = "copy";
    IVar16 = GetFunctionContextMemberName(ctx,data->name->name,suffix_00,uVar6);
    uVar6 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar6 + 1;
    pVVar12 = anon_unknown.dwarf_9c70f::AllocateClassMember
                        (ctx,source,uVar13,pTVar2,IVar16,SUB41(uVar6,0),in_stack_ffffffffffffff80);
    iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar10 = (MemberHandle *)CONCAT44(extraout_var_01,iVar15);
    pMVar10->source = (SynBase *)0x0;
    pMVar10->variable = pVVar12;
    pMVar10->initializer = (SynBase *)0x0;
    pMVar10->next = (MemberHandle *)0x0;
    pMVar10->listed = false;
    IntrusiveList<MemberHandle>::push_back(this,pMVar10);
    ctx->scope = pSVar4;
    data->usedAsExternal = true;
    iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    local_38 = (UpvalueData *)CONCAT44(extraout_var_02,iVar15);
    local_38->variable = local_40;
    local_38->target = pVVar9;
    local_38->nextUpvalue = pVVar11;
    local_38->copy = pVVar12;
    local_38->next = (UpvalueData *)0x0;
    local_38->listed = false;
    IntrusiveList<UpvalueData>::push_back(&function->upvalues,local_38);
    SmallDenseMap<VariableData_*,_UpvalueData_*,_VariableDataHasher,_2U>::insert
              (&function->upvalueVariableMap,&local_40,&local_38);
    SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::insert
              (&function->upvalueNameSet,&local_40->name->name);
    return pVVar9;
  }
  __assert_fail("classType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0xffb,
                "VariableData *AddFunctionUpvalue(ExpressionContext &, SynBase *, FunctionData *, VariableData *)"
               );
}

Assistant:

VariableData* AddFunctionUpvalue(ExpressionContext &ctx, SynBase *source, FunctionData *function, VariableData *data)
{
	if(UpvalueData **prev = function->upvalueVariableMap.find(data))
		return (*prev)->target;

	TypeRef *refType = getType<TypeRef>(function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	ScopeData *currScope = ctx.scope;

	ctx.scope = classType->typeScope;

	unsigned index = 0;

	if(function->upvalueNameSet.contains(data->name->name))
		index = classType->members.size();

	// Pointer to target variable
	VariableData *target = AllocateClassMember(ctx, source, 0, ctx.GetReferenceType(data->type), GetFunctionContextMemberName(ctx, data->name->name, InplaceStr("target"), index), true, ctx.uniqueVariableId++);

	classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, target, NULL));

	// Pointer to next upvalue
	VariableData *nextUpvalue = AllocateClassMember(ctx, source, 0, ctx.GetReferenceType(ctx.typeVoid), GetFunctionContextMemberName(ctx, data->name->name, InplaceStr("nextUpvalue"), index), true, ctx.uniqueVariableId++);

	classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, nextUpvalue, NULL));

	// Copy of the data
	VariableData *copy = AllocateClassMember(ctx, source, data->alignment, data->type, GetFunctionContextMemberName(ctx, data->name->name, InplaceStr("copy"), index), true, ctx.uniqueVariableId++);

	classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, copy, NULL));

	ctx.scope = currScope;

	data->usedAsExternal = true;

	UpvalueData *upvalue = new (ctx.get<UpvalueData>()) UpvalueData(data, target, nextUpvalue, copy);

	function->upvalues.push_back(upvalue);

	function->upvalueVariableMap.insert(data, upvalue);
	function->upvalueNameSet.insert(data->name->name);

	return target;
}